

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O0

Gia_Man_t * Gia_ManFramesInit(Gia_Man_t *pAig,Gia_ParFra_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Gia_ManFra_t *p_00;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Gia_Man_t *p_04;
  bool bVar9;
  uint local_60;
  int local_5c;
  int f;
  int i;
  Vec_Int_t *vOuts;
  Vec_Int_t *vAnds;
  Vec_Int_t *vIns;
  Gia_Obj_t *pObj;
  Gia_ManFra_t *p;
  Gia_Man_t *pTemp;
  Gia_Man_t *pFrames;
  int fUseAllPis;
  Gia_ParFra_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  p_00 = Gia_ManFraStart(pAig,pPars);
  Gia_ManFraSupports(p_00);
  iVar1 = Vec_VecSizeSize((Vec_Vec_t *)p_00->vIns);
  iVar2 = Vec_VecSizeSize((Vec_Vec_t *)p_00->vAnds);
  iVar3 = Vec_VecSizeSize((Vec_Vec_t *)p_00->vOuts);
  pTemp = Gia_ManStart(iVar1 + iVar2 + iVar3);
  pcVar7 = Abc_UtilStrsav(pAig->pName);
  pTemp->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(pAig->pSpec);
  pTemp->pSpec = pcVar7;
  Gia_ManHashAlloc(pTemp);
  pGVar8 = Gia_ManConst0(pAig);
  pGVar8->Value = 0;
  local_60 = 0;
  do {
    if (pPars->nFrames <= (int)local_60) {
      Gia_ManFraStop(p_00);
      Gia_ManHashStop(pTemp);
      iVar1 = Gia_ManCombMarkUsed(pTemp);
      iVar2 = Gia_ManAndNum(pTemp);
      if (iVar1 < iVar2) {
        p_04 = Gia_ManDupMarked(pTemp);
        if (pPars->fVerbose != 0) {
          uVar4 = Gia_ManAndNum(pTemp);
          uVar5 = Gia_ManAndNum(p_04);
          printf("Before cleanup = %d nodes. After cleanup = %d nodes.\n",(ulong)uVar4,(ulong)uVar5)
          ;
        }
        Gia_ManStop(pTemp);
        pTemp = p_04;
      }
      else if (pPars->fVerbose != 0) {
        uVar4 = Gia_ManAndNum(pTemp);
        uVar5 = Gia_ManAndNum(pTemp);
        printf("Before cleanup = %d nodes. After cleanup = %d nodes.\n",(ulong)uVar4,(ulong)uVar5);
      }
      return pTemp;
    }
    p_01 = (Vec_Int_t *)Vec_PtrEntry(p_00->vIns,local_60);
    p_02 = (Vec_Int_t *)Vec_PtrEntry(p_00->vAnds,local_60);
    p_03 = (Vec_Int_t *)Vec_PtrEntry(p_00->vOuts,local_60);
    if (pPars->fVerbose != 0) {
      uVar4 = Vec_IntSize(p_01);
      uVar5 = Vec_IntSize(p_02);
      uVar6 = Vec_IntSize(p_03);
      printf("Frame %3d : CI = %6d. AND = %6d. CO = %6d.\n",(ulong)local_60,(ulong)uVar4,
             (ulong)uVar5,(ulong)uVar6);
    }
    local_5c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(pAig);
      bVar9 = false;
      if (local_5c < iVar1) {
        vIns = (Vec_Int_t *)Gia_ManCi(pAig,local_5c);
        bVar9 = vIns != (Vec_Int_t *)0x0;
      }
      if (!bVar9) break;
      iVar1 = Gia_ManAppendCi(pTemp);
      *(int *)&vIns->pArray = iVar1;
      local_5c = local_5c + 1;
    }
    if (local_60 == 0) {
      local_5c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p_01);
        bVar9 = false;
        if (local_5c < iVar1) {
          iVar1 = Vec_IntEntry(p_01,local_5c);
          vIns = (Vec_Int_t *)Gia_ManObj(pAig,iVar1);
          bVar9 = vIns != (Vec_Int_t *)0x0;
        }
        if (!bVar9) break;
        iVar1 = Gia_ObjIsCi((Gia_Obj_t *)vIns);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                        ,0x2f7,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
        }
        iVar1 = Gia_ObjIsPi(pAig,(Gia_Obj_t *)vIns);
        if (iVar1 == 0) {
          *(undefined4 *)&vIns->pArray = 0;
        }
        local_5c = local_5c + 1;
      }
    }
    else {
      local_5c = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p_01);
        bVar9 = false;
        if (local_5c < iVar1) {
          iVar1 = Vec_IntEntry(p_01,local_5c);
          vIns = (Vec_Int_t *)Gia_ManObj(pAig,iVar1);
          bVar9 = vIns != (Vec_Int_t *)0x0;
        }
        if (!bVar9) break;
        iVar1 = Gia_ObjIsCi((Gia_Obj_t *)vIns);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsCi(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                        ,0x300,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
        }
        iVar1 = Gia_ObjIsPi(pAig,(Gia_Obj_t *)vIns);
        if (iVar1 == 0) {
          pGVar8 = Gia_ObjRoToRi(pAig,(Gia_Obj_t *)vIns);
          *(uint *)&vIns->pArray = pGVar8->Value;
        }
        local_5c = local_5c + 1;
      }
    }
    local_5c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_02);
      bVar9 = false;
      if (local_5c < iVar1) {
        iVar1 = Vec_IntEntry(p_02,local_5c);
        vIns = (Vec_Int_t *)Gia_ManObj(pAig,iVar1);
        bVar9 = vIns != (Vec_Int_t *)0x0;
      }
      if (!bVar9) break;
      iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)vIns);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                      ,0x321,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
      }
      iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vIns);
      iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)vIns);
      iVar1 = Gia_ManHashAnd(pTemp,iVar1,iVar2);
      *(int *)&vIns->pArray = iVar1;
      local_5c = local_5c + 1;
    }
    local_5c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_03);
      bVar9 = false;
      if (local_5c < iVar1) {
        iVar1 = Vec_IntEntry(p_03,local_5c);
        vIns = (Vec_Int_t *)Gia_ManObj(pAig,iVar1);
        bVar9 = vIns != (Vec_Int_t *)0x0;
      }
      if (!bVar9) break;
      iVar1 = Gia_ObjIsCo((Gia_Obj_t *)vIns);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsCo(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                      ,0x326,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
      }
      iVar1 = Gia_ObjIsPo(pAig,(Gia_Obj_t *)vIns);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vIns);
        *(int *)&vIns->pArray = iVar1;
      }
      else {
        iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)vIns);
        iVar1 = Gia_ManAppendCo(pTemp,iVar1);
        *(int *)&vIns->pArray = iVar1;
      }
      local_5c = local_5c + 1;
    }
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFramesInit( Gia_Man_t * pAig, Gia_ParFra_t * pPars )
{
    int fUseAllPis = 1;
    Gia_Man_t * pFrames, * pTemp;
    Gia_ManFra_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vIns, * vAnds, * vOuts;
    int i, f;
    p = Gia_ManFraStart( pAig, pPars );
    Gia_ManFraSupports( p );
    pFrames = Gia_ManStart( Vec_VecSizeSize((Vec_Vec_t*)p->vIns)+
        Vec_VecSizeSize((Vec_Vec_t*)p->vAnds)+Vec_VecSizeSize((Vec_Vec_t*)p->vOuts) );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pAig)->Value = 0;
    for ( f = 0; f < pPars->nFrames; f++ )
    {
        vIns  = (Vec_Int_t *)Vec_PtrEntry( p->vIns,  f );
        vAnds = (Vec_Int_t *)Vec_PtrEntry( p->vAnds, f );
        vOuts = (Vec_Int_t *)Vec_PtrEntry( p->vOuts, f );
        if ( pPars->fVerbose )
            printf( "Frame %3d : CI = %6d. AND = %6d. CO = %6d.\n", 
            f, Vec_IntSize(vIns), Vec_IntSize(vAnds), Vec_IntSize(vOuts) );
        if ( fUseAllPis )
        {
            Gia_ManForEachPi( pAig, pObj, i )
                pObj->Value = Gia_ManAppendCi( pFrames );
            if ( f == 0 )
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( !Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = 0;
                }
            }
            else
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( !Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ObjRoToRi(pAig, pObj)->Value;
                }
            }
        }
        else
        {
            if ( f == 0 )
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ManAppendCi( pFrames );
                    else
                        pObj->Value = 0;
                }
            }
            else
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ManAppendCi( pFrames );
                    else
                        pObj->Value = Gia_ObjRoToRi(pAig, pObj)->Value;
                }
            }
        }
        Gia_ManForEachObjVec( vAnds, pAig, pObj, i )
        {
            assert( Gia_ObjIsAnd(pObj) );
            pObj->Value = Gia_ManHashAnd( pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        Gia_ManForEachObjVec( vOuts, pAig, pObj, i )
        {
            assert( Gia_ObjIsCo(pObj) );
            if ( Gia_ObjIsPo(pAig, pObj) )
                pObj->Value = Gia_ManAppendCo( pFrames, Gia_ObjFanin0Copy(pObj) );
            else
                pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
    }
    Gia_ManFraStop( p );
    Gia_ManHashStop( pFrames );
    if ( Gia_ManCombMarkUsed(pFrames) < Gia_ManAndNum(pFrames) )
    {
        pFrames = Gia_ManDupMarked( pTemp = pFrames );
        if ( pPars->fVerbose )
            printf( "Before cleanup = %d nodes. After cleanup = %d nodes.\n", 
                Gia_ManAndNum(pTemp), Gia_ManAndNum(pFrames) );
        Gia_ManStop( pTemp );
    }
    else if ( pPars->fVerbose )
            printf( "Before cleanup = %d nodes. After cleanup = %d nodes.\n", 
                Gia_ManAndNum(pFrames), Gia_ManAndNum(pFrames) );
    return pFrames;
}